

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_multi_getsock(Curl_easy *data,easy_pollset *ps,char *caller)

{
  uint uVar1;
  curl_socket_t cVar2;
  curl_trc_feat *pcVar3;
  bool bVar4;
  _Bool _Var5;
  _Bool _Var6;
  uint uVar7;
  size_t sVar8;
  code *get_socks_cb;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  
  Curl_pollset_reset(data,ps);
  if (data->conn == (connectdata *)0x0) {
    return;
  }
  switch(data->mstate) {
  case MSTATE_RESOLVING:
    Curl_pollset_add_socks(data,ps,Curl_resolv_getsock);
  case MSTATE_INIT:
  case MSTATE_PENDING:
  case MSTATE_SETUP:
  case MSTATE_CONNECT:
  case MSTATE_RATELIMITING:
  case MSTATE_DONE:
  case MSTATE_COMPLETED:
  case MSTATE_MSGSENT:
    bVar4 = false;
    goto LAB_00146728;
  case MSTATE_CONNECTING:
  case MSTATE_TUNNELING:
    get_socks_cb = connecting_getsock;
    break;
  case MSTATE_PROTOCONNECT:
  case MSTATE_PROTOCONNECTING:
    get_socks_cb = protocol_getsock;
    break;
  case MSTATE_DO:
  case MSTATE_DOING:
    get_socks_cb = doing_getsock;
    break;
  case MSTATE_DOING_MORE:
    get_socks_cb = domore_getsock;
    break;
  case MSTATE_DID:
  case MSTATE_PERFORMING:
    get_socks_cb = perform_getsock;
    break;
  default:
    bVar4 = false;
    Curl_failf(data,"multi_getsock: unexpected multi state %d");
    goto LAB_00146728;
  }
  Curl_pollset_add_socks(data,ps,get_socks_cb);
  Curl_conn_adjust_pollset(data,data->conn,ps);
  bVar4 = true;
LAB_00146728:
  uVar1 = ps->num;
  uVar7 = (uint)*(undefined8 *)&(data->set).field_0x89c;
  if (uVar1 == 2) {
    if (((uVar7 >> 0x1e & 1) != 0) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_trc_feat_multi.log_level)))) {
      pcVar11 = "IN";
      pcVar10 = "IN";
      if ((ps->actions[0] & 1) == 0) {
        pcVar10 = "";
      }
      pcVar12 = "OUT";
      pcVar9 = "OUT";
      if ((ps->actions[0] & 2) == 0) {
        pcVar9 = "";
      }
      uVar1 = ps->sockets[0];
      uVar7 = ps->sockets[1];
      if ((ps->actions[1] & 1) == 0) {
        pcVar11 = "";
      }
      if ((ps->actions[1] & 2) == 0) {
        pcVar12 = "";
      }
      sVar8 = Curl_llist_count(&(data->state).timeoutlist);
      Curl_trc_multi(data,"%s pollset[fd=%d %s%s, fd=%d %s%s], timeouts=%zu",caller,(ulong)uVar1,
                     pcVar10,pcVar9,(ulong)uVar7,pcVar11,pcVar12,sVar8);
    }
  }
  else if (uVar1 == 1) {
    if ((((uVar7 >> 0x1e & 1) != 0) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < Curl_trc_feat_multi.log_level)) {
      cVar2 = ps->sockets[0];
      pcVar10 = "IN";
      if ((ps->actions[0] & 1) == 0) {
        pcVar10 = "";
      }
      pcVar11 = "OUT";
      if ((ps->actions[0] & 2) == 0) {
        pcVar11 = "";
      }
      sVar8 = Curl_llist_count(&(data->state).timeoutlist);
      Curl_trc_multi(data,"%s pollset[fd=%d %s%s], timeouts=%zu",caller,cVar2,pcVar10,pcVar11,sVar8)
      ;
    }
  }
  else if (uVar1 == 0) {
    if (((uVar7 >> 0x1e & 1) != 0) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_trc_feat_multi.log_level)))) {
      sVar8 = Curl_llist_count(&(data->state).timeoutlist);
      _Var5 = Curl_creader_is_paused(data);
      _Var6 = Curl_cwriter_is_paused(data);
      Curl_trc_multi(data,"%s pollset[], timeouts=%zu, paused %d/%d (r/w)",caller,sVar8,(ulong)_Var5
                     ,(ulong)_Var6);
    }
  }
  else if ((((uVar7 >> 0x1e & 1) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) && (0 < Curl_trc_feat_multi.log_level)) {
    sVar8 = Curl_llist_count(&(data->state).timeoutlist);
    Curl_trc_multi(data,"%s pollset[fds=%u], timeouts=%zu",caller,(ulong)uVar1,sVar8);
  }
  if (((((bVar4) && (ps->num == 0)) &&
       ((sVar8 = Curl_llist_count(&(data->state).timeoutlist), sVar8 == 0 &&
        ((_Var5 = Curl_cwriter_is_paused(data), !_Var5 &&
         (_Var5 = Curl_creader_is_paused(data), !_Var5)))))) &&
      (_Var5 = Curl_conn_is_ip_connected(data,0), _Var5)) &&
     ((((data->set).field_0x89f & 0x40) != 0 &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))))
  {
    Curl_infof(data,"WARNING: no socket in pollset or timer, transfer may stall!");
    return;
  }
  return;
}

Assistant:

void Curl_multi_getsock(struct Curl_easy *data,
                        struct easy_pollset *ps,
                        const char *caller)
{
  bool expect_sockets = TRUE;

  /* If the transfer has no connection, this is fine. Happens when
     called via curl_multi_remove_handle() => Curl_multi_ev_assess() =>
     Curl_multi_getsock(). */
  Curl_pollset_reset(data, ps);
  if(!data->conn)
    return;

  switch(data->mstate) {
  case MSTATE_INIT:
  case MSTATE_PENDING:
  case MSTATE_SETUP:
  case MSTATE_CONNECT:
    /* nothing to poll for yet */
    expect_sockets = FALSE;
    break;

  case MSTATE_RESOLVING:
    Curl_pollset_add_socks(data, ps, Curl_resolv_getsock);
    /* connection filters are not involved in this phase. It's ok if we get no
     * sockets to wait for. Resolving can wake up from other sources. */
    expect_sockets = FALSE;
    break;

  case MSTATE_CONNECTING:
  case MSTATE_TUNNELING:
    Curl_pollset_add_socks(data, ps, connecting_getsock);
    Curl_conn_adjust_pollset(data, data->conn, ps);
    break;

  case MSTATE_PROTOCONNECT:
  case MSTATE_PROTOCONNECTING:
    Curl_pollset_add_socks(data, ps, protocol_getsock);
    Curl_conn_adjust_pollset(data, data->conn, ps);
    break;

  case MSTATE_DO:
  case MSTATE_DOING:
    Curl_pollset_add_socks(data, ps, doing_getsock);
    Curl_conn_adjust_pollset(data, data->conn, ps);
    break;

  case MSTATE_DOING_MORE:
    Curl_pollset_add_socks(data, ps, domore_getsock);
    Curl_conn_adjust_pollset(data, data->conn, ps);
    break;

  case MSTATE_DID: /* same as PERFORMING in regard to polling */
  case MSTATE_PERFORMING:
    Curl_pollset_add_socks(data, ps, perform_getsock);
    Curl_conn_adjust_pollset(data, data->conn, ps);
    break;

  case MSTATE_RATELIMITING:
    /* we need to let time pass, ignore socket(s) */
    expect_sockets = FALSE;
    break;

  case MSTATE_DONE:
  case MSTATE_COMPLETED:
  case MSTATE_MSGSENT:
    /* nothing more to poll for */
    expect_sockets = FALSE;
    break;

  default:
    failf(data, "multi_getsock: unexpected multi state %d", data->mstate);
    DEBUGASSERT(0);
    expect_sockets = FALSE;
    break;
  }

  switch(ps->num) {
    case 0:
      CURL_TRC_M(data, "%s pollset[], timeouts=%zu, paused %d/%d (r/w)",
                 caller, Curl_llist_count(&data->state.timeoutlist),
                 Curl_creader_is_paused(data), Curl_cwriter_is_paused(data));
      break;
    case 1:
      CURL_TRC_M(data, "%s pollset[fd=%" FMT_SOCKET_T " %s%s], timeouts=%zu",
                 caller, ps->sockets[0],
                 (ps->actions[0] & CURL_POLL_IN) ? "IN" : "",
                 (ps->actions[0] & CURL_POLL_OUT) ? "OUT" : "",
                 Curl_llist_count(&data->state.timeoutlist));
      break;
    case 2:
      CURL_TRC_M(data, "%s pollset[fd=%" FMT_SOCKET_T " %s%s, "
                 "fd=%" FMT_SOCKET_T " %s%s], timeouts=%zu",
                 caller, ps->sockets[0],
                 (ps->actions[0] & CURL_POLL_IN) ? "IN" : "",
                 (ps->actions[0] & CURL_POLL_OUT) ? "OUT" : "",
                 ps->sockets[1],
                 (ps->actions[1] & CURL_POLL_IN) ? "IN" : "",
                 (ps->actions[1] & CURL_POLL_OUT) ? "OUT" : "",
                 Curl_llist_count(&data->state.timeoutlist));
      break;
    default:
      CURL_TRC_M(data, "%s pollset[fds=%u], timeouts=%zu",
                 caller, ps->num, Curl_llist_count(&data->state.timeoutlist));
      break;
  }
  if(expect_sockets && !ps->num &&
     !Curl_llist_count(&data->state.timeoutlist) &&
     !Curl_cwriter_is_paused(data) && !Curl_creader_is_paused(data) &&
     Curl_conn_is_ip_connected(data, FIRSTSOCKET)) {
    /* We expected sockets for POLL monitoring, but none are set.
     * We are not waiting on any timer.
     * None of the READ/WRITE directions are paused.
     * We are connected to the server on IP level, at least. */
    infof(data, "WARNING: no socket in pollset or timer, transfer may stall!");
    DEBUGASSERT(0);
  }
}